

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

void nh_http_parse_get_body_len(http_context_t *ctx)

{
  byte bVar1;
  uint32_t uVar2;
  uint uVar3;
  ulong uVar4;
  http_string_t hVar5;
  
  hVar5 = get_request_header(ctx,"Content-Length");
  uVar2 = 0;
  if ((hVar5.len != 0) && (uVar2 = 0, hVar5.value != (char *)0x0)) {
    uVar4 = 0;
    uVar3 = 1;
    uVar2 = 0;
    do {
      bVar1 = hVar5.value[uVar4];
      if (9 < (byte)(bVar1 - 0x30)) break;
      uVar2 = ((uint)bVar1 + uVar2 * 10) - 0x30;
      uVar4 = (ulong)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar4 < hVar5.len);
  }
  ctx->body_len = uVar2;
  return;
}

Assistant:

void nh_http_parse_get_body_len(http_context_t *ctx) {
    http_string_t length_str = get_request_header(ctx, "Content-Length");
    if (length_str.len == 0) {
        ctx->body_len = 0;
    } else {
        uint32_t length = nh_string_to_uint(length_str);
        ctx->body_len = length > 0 ? length : 0;
    }
}